

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O2

bool OrderEdgesAroundOpenVertex(ON_Brep *B,int vid,ON_2dex *trim_ends)

{
  int iVar1;
  int iVar2;
  ON_BrepVertex *pOVar3;
  uint *puVar4;
  uint uVar5;
  ulong uVar6;
  ON_BrepEdge *pOVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ON_BrepTrim *pOVar13;
  bool bVar14;
  
  if (vid < 0) {
    return false;
  }
  pOVar3 = (B->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>.m_a;
  if ((-1 < pOVar3[(uint)vid].m_vertex_index) &&
     (uVar5 = pOVar3[(uint)vid].m_ei.m_count, uVar6 = (ulong)uVar5, 1 < (int)uVar5)) {
    pOVar7 = (B->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_a;
    uVar12 = 0xffffffffffffffff;
    uVar10 = 0;
    uVar11 = 0xffffffff;
    while( true ) {
      if (uVar6 == uVar10) break;
      iVar1 = pOVar3[(uint)vid].m_ei.m_a[uVar10];
      if (pOVar7[iVar1].m_edge_index < 0) {
        return false;
      }
      if (pOVar7[iVar1].m_ti.m_count == 1) {
        if ((int)(uint)uVar11 < 0) {
          uVar11 = uVar10 & 0xffffffff;
        }
        else {
          if (-1 < (int)(uint)uVar12) {
            return false;
          }
          uVar12 = uVar10 & 0xffffffff;
        }
      }
      uVar10 = uVar10 + 1;
    }
    if (-1 < (int)((uint)uVar11 | (uint)uVar12)) {
      iVar1 = pOVar3[(uint)vid].m_ei.m_a[uVar11];
      iVar2 = pOVar7[iVar1].m_vi[0];
      iVar1 = *pOVar7[iVar1].m_ti.m_a;
      lVar9 = (long)iVar1;
      pOVar13 = (B->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a;
      trim_ends->i = iVar1;
      bVar14 = pOVar13[lVar9].m_bRev3d == (iVar2 == vid);
      uVar5 = (uint)bVar14;
      trim_ends->j = (uint)bVar14;
      for (lVar8 = 0; lVar8 < (int)uVar6; lVar8 = lVar8 + 1) {
        if (uVar5 == 0) {
          uVar5 = ON_Brep::PrevNonsingularTrim(B,(int)lVar9);
        }
        else {
          uVar5 = ON_Brep::NextNonsingularTrim(B,(int)lVar9);
        }
        if ((int)uVar5 < 0) {
          return false;
        }
        pOVar13 = (B->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a +
                  uVar5;
        pOVar7 = ON_BrepTrim::Edge(pOVar13);
        if (pOVar7 == (ON_BrepEdge *)0x0) {
          return false;
        }
        iVar1 = (pOVar7->m_ti).m_count;
        if (2 < iVar1) {
          return false;
        }
        if (iVar1 == 1) {
          if (pOVar13->m_ei != pOVar3[(uint)vid].m_ei.m_a[uVar12 & 0xffffffff]) {
            return false;
          }
          if ((int)lVar8 - pOVar3[(uint)vid].m_ei.m_count != -2) {
            return false;
          }
          trim_ends[lVar8 + 1].i = uVar5;
          trim_ends[lVar8 + 1].j = 1 - trim_ends[lVar8].j;
          return true;
        }
        puVar4 = (uint *)(pOVar7->m_ti).m_a;
        uVar5 = puVar4[*puVar4 == uVar5];
        lVar9 = (long)(int)uVar5;
        trim_ends[lVar8 + 1].i = uVar5;
        uVar5 = 1 - trim_ends[lVar8].j;
        if ((B->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_a[lVar9].
            m_bRev3d != pOVar13->m_bRev3d) {
          uVar5 = trim_ends[lVar8].j;
        }
        trim_ends[lVar8 + 1].j = uVar5;
        uVar6 = (ulong)(uint)pOVar3[(uint)vid].m_ei.m_count;
      }
    }
  }
  return false;
}

Assistant:

bool OrderEdgesAroundOpenVertex(const ON_Brep& B, int vid, ON_2dex* trim_ends)

{
  if (vid<0)
    return false;
  const ON_BrepVertex& V = B.m_V[vid];
  if (V.m_vertex_index < 0)
    return false;
  if (V.m_ei.Count() < 2)
    return false;
  int i;
  int start = -1;
  int end = -1;
  for (i=0; i<V.m_ei.Count(); i++){
    const ON_BrepEdge& E = B.m_E[V.m_ei[i]];
    if (E.m_edge_index < 0)
      return false;
    if (E.m_ti.Count() == 1){
      if (start < 0)
        start = i;
      else if (end < 0)
        end = i;
      else
        return false;
    }
  }
  if (start < 0 || end < 0)
    return false;
  const ON_BrepEdge& StartE = B.m_E[V.m_ei[start]];
  bool bAtStart = (StartE.m_vi[0] == vid) ? true : false;
  const ON_BrepTrim& StartT = B.m_T[StartE.m_ti[0]];
  ON_2dex& start_te = trim_ends[0];
  start_te.i = StartE.m_ti[0];
  start_te.j = (bAtStart == StartT.m_bRev3d) ? 1 : 0;
  int count = 0;
  while (count < V.m_ei.Count()){
    const ON_2dex& lte = trim_ends[count];
    count++;
    int next_ti =  (lte.j) ? B.NextNonsingularTrim(lte.i) : B.PrevNonsingularTrim(lte.i);
   if (next_ti<0)
     return false;
   const ON_BrepTrim& NT = B.m_T[next_ti];
   const ON_BrepEdge* pNE = NT.Edge();
   if (!pNE)
     return false;
   if (pNE->m_ti.Count() > 2)
     return false;
   if (pNE->m_ti.Count() == 1){
     if (NT.m_ei == V.m_ei[end]){
       if (count != V.m_ei.Count()-1)
         return false;
       ON_2dex& end_te = trim_ends[count];
       end_te.i = next_ti;
       end_te.j = 1-lte.j;
       return true;
     }
     return false;
   }
   ON_2dex& nte = trim_ends[count];
   nte.i = (pNE->m_ti[0] == next_ti) ? pNE->m_ti[1] : pNE->m_ti[0];
   const ON_BrepTrim& NTi = B.m_T[nte.i];
   nte.j = (NTi.m_bRev3d == NT.m_bRev3d) ? 1-lte.j : lte.j;
  }
  return false;
}